

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O2

bool check_event(Am_Object *inter,Am_Object *event_window,Am_Input_Char input_char,
                Am_Slot_Key when_slot,Am_Input_Char *deferred)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Value slot_value;
  Am_Value list_value;
  Am_Value_List choices;
  
  slot_value.type = 0;
  slot_value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(inter,when_slot,1);
  Am_Value::operator=(&slot_value,pAVar3);
  Am_Input_Char::operator=(deferred,&Am_No_Input_Char);
  bVar1 = Am_Value_List::Test(&slot_value);
  if (bVar1) {
    Am_Value_List::Am_Value_List(&choices,&slot_value);
    list_value.type = 0;
    list_value.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Value_List::Start(&choices);
    while( true ) {
      bVar1 = Am_Value_List::Last(&choices);
      if (bVar1) break;
      pAVar3 = Am_Value_List::Get(&choices);
      Am_Value::operator=(&list_value,pAVar3);
      bVar2 = int_check_event(inter,event_window,input_char,0,&list_value,deferred);
      if (bVar2) break;
      Am_Value_List::Next(&choices);
    }
    bVar1 = !bVar1;
    Am_Value::~Am_Value(&list_value);
    Am_Value_List::~Am_Value_List(&choices);
  }
  else {
    bVar1 = int_check_event(inter,event_window,input_char,when_slot,&slot_value,deferred);
  }
  Am_Value::~Am_Value(&slot_value);
  return bVar1;
}

Assistant:

static bool
check_event(Am_Object &inter, Am_Object &event_window, Am_Input_Char input_char,
            Am_Slot_Key when_slot, Am_Input_Char &deferred)
{
  Am_Value slot_value;
  slot_value = inter.Peek(when_slot);
  deferred = Am_No_Input_Char; //normal case

#ifdef DEBUG
  if (Am_Inter_Tracing(inter)) {
    std::cout << "Checking ";
    switch (when_slot) {
    case Am_START_WHEN:
      std::cout << "start";
      break;
    case Am_ABORT_WHEN:
      std::cout << "abort";
      break;
    case Am_STOP_WHEN:
      std::cout << "stop";
      break;
    }
    std::cout << " event = ";
  }
#endif
  if (Am_Value_List::Test(slot_value)) {
    Am_Value_List choices = slot_value;
    Am_Value list_value;
    Am_INTER_TRACE_PRINT(inter, " LIST");
    for (choices.Start(); !choices.Last(); choices.Next()) {
      list_value = choices.Get();
      Am_INTER_TRACE_PRINT_NOENDL(inter, "  Checking ");
      if (int_check_event(inter, event_window, input_char, 0, list_value,
                          deferred))
        return true;
    }
    return false; //nothing in the list matches
  } else
    return int_check_event(inter, event_window, input_char, when_slot,
                           slot_value, deferred);
}